

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O2

void __thiscall Time::add(Time *this,TimeDependent *object)

{
  pointer ppTVar1;
  uint i;
  uint uVar2;
  bool bVar3;
  TimeDependent *local_8;
  
  ppTVar1 = (this->timeObjects).
            super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = false;
  uVar2 = 0;
  while( true ) {
    if (bVar3) {
      return;
    }
    if ((ulong)((long)(this->timeObjects).
                      super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= (ulong)uVar2)
    break;
    bVar3 = ppTVar1[uVar2] == object;
    uVar2 = uVar2 + 1;
  }
  local_8 = object;
  std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::push_back
            (&this->timeObjects,&local_8);
  return;
}

Assistant:

void Time::add( class TimeDependent *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeObjects.size(); ++i)
		if (timeObjects[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeObjects.push_back( object );
}